

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O1

string * __thiscall
Json::JsonParser::parseNull_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  JsonReader *this_00;
  int iVar1;
  string *psVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  JsonException *this_01;
  int iVar7;
  long *plVar8;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  string local_50;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  this_00 = &this->__reader;
  local_58 = __return_storage_ptr__;
  while( true ) {
    JsonReader::substr_abi_cxx11_(&local_50,this_00,3,false);
    plVar6 = (long *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_68 = *plVar8;
      lStack_60 = plVar6[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar8;
      local_78 = (long *)*plVar6;
    }
    local_70 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar5 = std::__cxx11::string::compare((char *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      std::__cxx11::string::append((char *)this);
      iVar1 = (this->__reader).__ptr;
      iVar7 = (this->__reader).__len;
      iVar5 = iVar1 + 3;
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      if (iVar1 < -2) {
        iVar7 = 0;
      }
      (this->__reader).__ptr = iVar7;
    }
    cVar3 = JsonReader::peek(this_00);
    psVar2 = local_58;
    if (((cVar3 == ',') || (cVar3 == ']')) || (cVar3 == '}')) break;
    bVar4 = JsonReader::get(this_00);
    if ((0x20 < bVar4) || ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      __cxa_throw(this_01,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,(this->__buffer_value)._M_dataplus._M_p,(allocator<char> *)&local_78
            );
  return psVar2;
}

Assistant:

std::string Json::JsonParser::parseNull(char prev) {
    buffer_reset();
    for (;;) {
        if (prev + __reader.substr(3) == "null") {
            buffer_append("null");
            __reader.moveTo(3);
        }
        char c = __reader.peek();
        if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END) {
            break;
        } else if (is_space_char(__reader.get()))continue;
        else throw JsonException(__reader);
    }
    return buffer_str();
}